

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase36::run(TestCase36 *this)

{
  TransformPromiseNodeBase *this_00;
  bool done;
  Promise<void> promise;
  WaitScope waitScope;
  Own<kj::_::PromiseNode> local_78;
  Own<kj::_::PromiseNode> local_68;
  Own<kj::_::PromiseNode> local_58;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  done = false;
  _::yield();
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_78,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:42:37),_kj::_::PropagateException>
             ::anon_class_8_1_898ad080_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00419bd0;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&done;
  local_68.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase36::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_58.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase36::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_68.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase36::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_58.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)this_00;
  Own<kj::_::PromiseNode>::dispose(&local_58);
  Own<kj::_::PromiseNode>::dispose(&local_68);
  Own<kj::_::PromiseNode>::dispose(&local_78);
  if ((done == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[25]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2b,ERROR,"\"failed: expected \" \"!(done)\"",
               (char (*) [25])"failed: expected !(done)");
  }
  Promise<void>::wait(&promise,&waitScope);
  if ((done == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[22]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2d,ERROR,"\"failed: expected \" \"done\"",(char (*) [22])"failed: expected done");
  }
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, EvalVoid) {
  EventLoop loop;
  WaitScope waitScope(loop);

  bool done = false;

  Promise<void> promise = evalLater([&]() { done = true; });
  EXPECT_FALSE(done);
  promise.wait(waitScope);
  EXPECT_TRUE(done);
}